

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es3fShaderMatrixTests.cpp
# Opt level: O0

void deqp::gles3::Functional::MatrixCaseUtils::Evaluator<14,_5,_94>::evaluate
               (ShaderEvalContext *evalCtx,InputType in0Type,InputType in1Type)

{
  VecAccess<float,_4,_3> local_80;
  Mat2 local_68;
  Vector<float,_3> local_58 [2];
  Vector<float,_3> local_40;
  Vector<float,_3> local_34;
  undefined1 local_28 [8];
  Type in0;
  InputType in1Type_local;
  InputType in0Type_local;
  ShaderEvalContext *evalCtx_local;
  
  in0.m_data.m_data[1].m_data[0] = (float)in1Type;
  in0.m_data.m_data[1].m_data[1] = (float)in0Type;
  if (in0Type == INPUTTYPE_DYNAMIC) {
    getInputValue<2,5>((MatrixCaseUtils *)local_28,evalCtx,0);
  }
  else {
    getInputValue<0,5>((MatrixCaseUtils *)local_28,evalCtx,0);
  }
  reduceToVec3((MatrixCaseUtils *)&local_40,(Mat2 *)local_28);
  decrement<float,2,2>((MatrixCaseUtils *)&local_68,(Matrix<float,_2,_2> *)local_28);
  reduceToVec3((MatrixCaseUtils *)local_58,&local_68);
  tcu::operator+((tcu *)&local_34,&local_40,local_58);
  tcu::Vector<float,_4>::xyz(&local_80,&evalCtx->color);
  tcu::VecAccess<float,_4,_3>::operator=(&local_80,&local_34);
  tcu::Matrix<float,_2,_2>::~Matrix(&local_68);
  tcu::Matrix<float,_2,_2>::~Matrix((Matrix<float,_2,_2> *)local_28);
  return;
}

Assistant:

static void evaluate (ShaderEvalContext& evalCtx, InputType in0Type, InputType in1Type)
	{
		DE_UNREF(in1Type);
		typename TypeTraits<In0DataType>::Type	in0	= (in0Type == INPUTTYPE_DYNAMIC) ? getInputValue<INPUTTYPE_DYNAMIC, In0DataType>(evalCtx, 0)
																				     : getInputValue<INPUTTYPE_CONST,	In0DataType>(evalCtx, 0);

		// modifying reduction: sum modified value too
		evalCtx.color.xyz() = reduceToVec3(in0) + reduceToVec3(decrement(in0));
	}